

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O3

CURLcode Curl_conn_tcp_listen_set(Curl_easy *data,connectdata *conn,int sockindex,curl_socket_t *s)

{
  CURLcode CVar1;
  uint *ctx;
  Curl_cfilter *pCVar2;
  curltime cVar3;
  Curl_cfilter *cf;
  Curl_cfilter *local_38;
  
  local_38 = (Curl_cfilter *)0x0;
  Curl_conn_cf_discard_all(data,conn,sockindex);
  ctx = (uint *)(*Curl_ccalloc)(1,0x180);
  if (ctx == (uint *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
    pCVar2 = (Curl_cfilter *)0x0;
  }
  else {
    *ctx = (uint)conn->transport;
    ctx[0x26] = *s;
    *(byte *)(ctx + 0x5f) = (byte)ctx[0x5f] & 0xfd;
    CVar1 = Curl_cf_create(&local_38,&Curl_cft_tcp_accept,ctx);
    pCVar2 = local_38;
    if (CVar1 == CURLE_OK) {
      Curl_conn_cf_add(data,conn,sockindex,local_38);
      conn->sock[sockindex] = ctx[0x26];
      set_local_ip((Curl_cfilter *)local_38->ctx,data);
      *(byte *)(ctx + 0x5f) = (byte)ctx[0x5f] | 8;
      cVar3 = Curl_now();
      *(time_t *)(ctx + 0x56) = cVar3.tv_sec;
      ctx[0x58] = cVar3.tv_usec;
      local_38->field_0x24 = local_38->field_0x24 | 1;
      if (data == (Curl_easy *)0x0) {
        return CURLE_OK;
      }
      if (((data->set).field_0x8bd & 0x10) == 0) {
        return CURLE_OK;
      }
      if (local_38->cft->log_level < 1) {
        return CURLE_OK;
      }
      Curl_trc_cf_infof(data,local_38,"Curl_conn_tcp_listen_set(%d)",(ulong)ctx[0x26]);
      return CURLE_OK;
    }
  }
  (*Curl_cfree)(pCVar2);
  local_38 = (Curl_cfilter *)0x0;
  (*Curl_cfree)(ctx);
  return CVar1;
}

Assistant:

CURLcode Curl_conn_tcp_listen_set(struct Curl_easy *data,
                                  struct connectdata *conn,
                                  int sockindex, curl_socket_t *s)
{
  CURLcode result;
  struct Curl_cfilter *cf = NULL;
  struct cf_socket_ctx *ctx = NULL;

  /* replace any existing */
  Curl_conn_cf_discard_all(data, conn, sockindex);
  DEBUGASSERT(conn->sock[sockindex] == CURL_SOCKET_BAD);

  ctx = calloc(1, sizeof(*ctx));
  if(!ctx) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }
  ctx->transport = conn->transport;
  ctx->sock = *s;
  ctx->accepted = FALSE;
  result = Curl_cf_create(&cf, &Curl_cft_tcp_accept, ctx);
  if(result)
    goto out;
  Curl_conn_cf_add(data, conn, sockindex, cf);

  conn->sock[sockindex] = ctx->sock;
  set_local_ip(cf, data);
  ctx->active = TRUE;
  ctx->connected_at = Curl_now();
  cf->connected = TRUE;
  CURL_TRC_CF(data, cf, "Curl_conn_tcp_listen_set(%"
              CURL_FORMAT_SOCKET_T ")", ctx->sock);

out:
  if(result) {
    Curl_safefree(cf);
    Curl_safefree(ctx);
  }
  return result;
}